

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_identities_derived(lysc_ctx *ctx,lysp_ident *idents_p,lysc_ident **idents)

{
  LY_ERR LVar1;
  ulong local_70;
  ulong local_60;
  ulong local_50;
  ulong uStack_38;
  LY_ERR ret__;
  uint64_t v;
  uint64_t u;
  lysc_ident **idents_local;
  lysp_ident *idents_p_local;
  lysc_ctx *ctx_local;
  
  lysc_update_path(ctx,(lys_module *)0x0,"{identity}");
  v = 0;
  while( true ) {
    if (*idents == (lysc_ident *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = *(ulong *)&(*idents)[-1].flags;
    }
    if (local_50 <= v) break;
    uStack_38 = 0;
    while( true ) {
      if (idents_p == (lysp_ident *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = *(ulong *)&idents_p[-1].flags;
      }
      if ((local_60 <= uStack_38) || (idents_p[uStack_38].name == (*idents)[v].name)) break;
      uStack_38 = uStack_38 + 1;
    }
    if (idents_p == (lysp_ident *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = *(ulong *)&idents_p[-1].flags;
    }
    if ((uStack_38 != local_70) && (idents_p[uStack_38].bases != (char **)0x0)) {
      lysc_update_path(ctx,(lys_module *)0x0,(*idents)[v].name);
      LVar1 = lys_compile_identity_bases
                        (ctx,ctx->pmod,idents_p[uStack_38].bases,*idents + v,(lysc_ident ***)0x0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    }
    v = v + 1;
  }
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_identities_derived(struct lysc_ctx *ctx, struct lysp_ident *idents_p, struct lysc_ident **idents)
{
    LY_ARRAY_COUNT_TYPE u, v;

    lysc_update_path(ctx, NULL, "{identity}");

    for (u = 0; u < LY_ARRAY_COUNT(*idents); ++u) {
        /* find matching parsed identity */
        for (v = 0; v < LY_ARRAY_COUNT(idents_p); ++v) {
            if (idents_p[v].name == (*idents)[u].name) {
                break;
            }
        }

        if ((v == LY_ARRAY_COUNT(idents_p)) || !idents_p[v].bases) {
            /* identity not found (it may be from a submodule) or identity without bases */
            continue;
        }

        lysc_update_path(ctx, NULL, (*idents)[u].name);
        LY_CHECK_RET(lys_compile_identity_bases(ctx, ctx->pmod, idents_p[v].bases, &(*idents)[u], NULL));
        lysc_update_path(ctx, NULL, NULL);
    }

    lysc_update_path(ctx, NULL, NULL);
    return LY_SUCCESS;
}